

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::PackagesListConfig::ParseFromArray
          (PackagesListConfig *this,void *raw,size_t size)

{
  byte bVar1;
  uint uVar2;
  Field *pFVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  Field *pFVar7;
  Field *pFVar8;
  Field *pFVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  Field *pFVar13;
  ulong uVar14;
  Field *pFVar15;
  ulong uVar16;
  bool bVar17;
  ulong local_60;
  Field local_58;
  Field *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_38 = &this->package_name_filter_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_38,(this->package_name_filter_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_40 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  pFVar7 = (Field *)(size + (long)raw);
  do {
    lVar4 = 7;
    if (pFVar7 <= raw) goto LAB_0023933c;
    uVar12 = (ulong)(char)((Field *)raw)->int_value_;
    pFVar15 = (Field *)((long)&((Field *)raw)->int_value_ + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)((Field *)raw)->int_value_;
      uVar6 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      pFVar3 = pFVar15;
      for (; (uVar12 = uVar6, pFVar9 = pFVar3, (char)bVar1 < '\0' &&
             (bVar17 = 0x38 < lVar4 - 7U, bVar10 = bVar17 || pFVar7 <= pFVar3, uVar12 = 0,
             pFVar9 = pFVar15, !bVar17 && pFVar7 > pFVar3)); lVar4 = lVar4 + 7) {
        bVar1 = (byte)pFVar3->int_value_;
        pFVar3 = (Field *)((long)&pFVar3->int_value_ + 1);
        uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
      }
      pFVar15 = pFVar9;
      if (bVar10) {
        pFVar15 = (Field *)raw;
        uVar12 = 0;
      }
      if (pFVar15 == (Field *)raw) goto LAB_0023933c;
    }
    uVar5 = (uint)(uVar12 >> 3);
    if (((uVar5 == 0) || (pFVar7 <= pFVar15)) || (5 < ((byte)uVar12 & 7))) {
switchD_002391ae_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      pFVar3 = (Field *)raw;
      uVar6 = 0;
    }
    else {
      uVar2 = (uint)uVar12 & 7;
      pFVar3 = (Field *)((long)&switchD_002391ae::switchdataD_0034d7b0 +
                        (long)(int)(&switchD_002391ae::switchdataD_0034d7b0)[uVar2]);
      switch(uVar2) {
      case 0:
        uVar14 = 0;
        bVar10 = pFVar15 >= pFVar7;
        if (pFVar15 < pFVar7) {
          pFVar3 = (Field *)((long)&pFVar15->int_value_ + 1);
          bVar1 = (byte)pFVar15->int_value_;
          uVar16 = (ulong)(bVar1 & 0x7f);
          uVar11 = uVar16;
          uVar6 = 0;
          if ((char)bVar1 < '\0') {
            uVar11 = 0;
            uVar6 = 0;
            lVar4 = 7;
            pFVar9 = pFVar3;
            do {
              bVar17 = 0x38 < lVar4 - 7U;
              bVar10 = bVar17 || pFVar7 <= pFVar9;
              if (bVar17 || pFVar7 <= pFVar9) goto LAB_00239343;
              bVar1 = (byte)pFVar9->int_value_;
              pFVar9 = (Field *)((long)&pFVar9->int_value_ + 1);
              uVar16 = uVar16 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
              lVar4 = lVar4 + 7;
            } while ((char)bVar1 < '\0');
            uVar11 = uVar16 & 0xffffffff;
            pFVar3 = pFVar9;
            uVar6 = uVar16 >> 0x20;
          }
        }
        else {
          uVar11 = 0;
          uVar6 = 0;
        }
LAB_00239343:
        if (bVar10) {
          uVar6 = 0;
          pFVar3 = pFVar15;
          uVar11 = uVar14;
        }
        local_48 = (Field *)raw;
        if (pFVar3 != pFVar15) goto LAB_0023936f;
        uVar12 = 0;
        bVar10 = false;
        pFVar3 = (Field *)raw;
        uVar6 = uVar14;
        goto LAB_002393b0;
      case 1:
        pFVar3 = (Field *)&pFVar15->size_;
        if (pFVar7 < pFVar3) {
LAB_0023933c:
          uVar12 = 0;
          bVar10 = false;
          pFVar3 = (Field *)raw;
          uVar6 = 0;
          goto LAB_002393b0;
        }
        uVar11 = pFVar15->int_value_;
        uVar6 = uVar11 >> 0x20;
        break;
      case 2:
        bVar10 = pFVar15 >= pFVar7;
        uVar11 = local_60;
        if (pFVar15 < pFVar7) {
          pFVar9 = (Field *)((long)&pFVar15->int_value_ + 1);
          bVar1 = (byte)pFVar15->int_value_;
          uVar6 = (ulong)(bVar1 & 0x7f);
          pFVar3 = pFVar9;
          uVar11 = uVar6;
          if ((char)bVar1 < '\0') {
            lVar4 = 7;
            pFVar8 = pFVar9;
            do {
              bVar10 = 0x38 < lVar4 - 7U || pFVar7 <= pFVar8;
              pFVar3 = pFVar9;
              uVar11 = local_60;
              if (bVar10) break;
              bVar1 = (byte)pFVar8->int_value_;
              pFVar3 = (Field *)((long)&pFVar8->int_value_ + 1);
              uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
              lVar4 = lVar4 + 7;
              pFVar8 = pFVar3;
              uVar11 = uVar6;
            } while ((char)bVar1 < '\0');
          }
        }
        uVar6 = 0;
        local_60 = uVar11;
        if (bVar10) {
          pFVar3 = pFVar15;
          local_60 = uVar6;
        }
        if (pFVar3 == pFVar15) {
          uVar11 = 0;
          bVar10 = false;
          uVar14 = 0;
        }
        else if ((ulong)((long)pFVar7 - (long)pFVar3) < local_60) {
          uVar6 = 0;
          uVar11 = 0;
          bVar10 = false;
          uVar14 = 0;
        }
        else {
          uVar6 = (ulong)pFVar3 >> 0x20;
          uVar11 = (ulong)pFVar3 & 0xffffffff;
          pFVar3 = (Field *)((long)&pFVar3->int_value_ + local_60);
          bVar10 = true;
          uVar14 = local_60;
        }
        if (!bVar10) goto LAB_0023933c;
        goto LAB_0023936f;
      default:
        goto switchD_002391ae_caseD_3;
      case 5:
        pFVar3 = (Field *)((long)&pFVar15->int_value_ + 4);
        uVar6 = 0;
        if (pFVar7 < pFVar3) goto LAB_0023933c;
        uVar11 = (ulong)(uint)pFVar15->int_value_;
      }
      uVar14 = 0;
LAB_0023936f:
      bVar10 = true;
      if ((uVar5 < 0x10000) && (uVar14 < 0x10000000)) {
        uVar6 = uVar11 & 0xffffffff | uVar6 << 0x20;
        uVar12 = uVar14 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        uVar6 = 0;
        uVar12 = 0;
      }
    }
LAB_002393b0:
    raw = pFVar3;
    local_58.int_value_ = uVar6;
    if (!bVar10) {
      do {
        local_58.size_ = (uint32_t)uVar12;
        local_58.type_ = (uint8_t)(uVar12 >> 0x30);
        local_58.id_ = (uint16_t)(uVar12 >> 0x20);
        if (local_58.id_ == 1) {
          *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
               (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(local_38);
          protozero::Field::get
                    (&local_58,
                     (this->package_name_filter_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
        }
        else {
          if (local_58.id_ == 0) {
            return pFVar7 == pFVar3;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,local_40);
        }
        do {
          pFVar15 = &local_58;
          if (pFVar7 <= pFVar3) {
LAB_00239559:
            uVar12 = 0;
            bVar10 = false;
            local_58.int_value_ = 0;
            goto LAB_002397e8;
          }
          uVar12 = (ulong)(char)pFVar3->int_value_;
          pFVar9 = (Field *)((long)&pFVar3->int_value_ + 1);
          if ((long)uVar12 < 0) {
            bVar1 = (byte)pFVar3->int_value_;
            uVar12 = (ulong)(bVar1 & 0x7f);
            bVar10 = false;
            pFVar8 = pFVar9;
            if ((char)bVar1 < '\0') {
              lVar4 = 7;
              uVar11 = uVar12;
              pFVar13 = pFVar9;
              do {
                bVar10 = 0x38 < lVar4 - 7U || pFVar7 <= pFVar13;
                uVar12 = 0;
                pFVar8 = pFVar9;
                if (bVar10) break;
                bVar1 = (byte)pFVar13->int_value_;
                pFVar8 = (Field *)((long)&pFVar13->int_value_ + 1);
                uVar12 = uVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
                lVar4 = lVar4 + 7;
                uVar11 = uVar12;
                pFVar13 = pFVar8;
              } while ((char)bVar1 < '\0');
            }
            pFVar9 = pFVar8;
            if (bVar10) {
              pFVar9 = pFVar3;
              uVar12 = 0;
            }
            if (pFVar9 == pFVar3) goto LAB_00239559;
          }
          uVar5 = (uint)(uVar12 >> 3);
          if ((uVar5 == 0) || (pFVar7 <= pFVar9)) {
switchD_002395f2_caseD_3:
            bVar10 = false;
            uVar12 = 0;
            local_58.int_value_ = 0;
            goto LAB_002397e8;
          }
          switch((uint)uVar12 & 7) {
          case 0:
            local_48 = pFVar3;
            uVar16 = 0;
            bVar10 = pFVar9 >= pFVar7;
            if (pFVar9 < pFVar7) {
              pFVar8 = (Field *)((long)&pFVar9->int_value_ + 1);
              bVar1 = (byte)pFVar9->int_value_;
              uVar2 = bVar1 & 0x7f;
              uVar11 = (ulong)uVar2;
              uVar14 = (ulong)uVar2;
              pFVar15 = pFVar8;
              uVar2 = 0;
              if ((char)bVar1 < '\0') {
                uVar14 = 0;
                lVar4 = 7;
                pFVar13 = pFVar8;
                do {
                  bVar17 = 0x38 < lVar4 - 7U;
                  bVar10 = bVar17 || pFVar7 <= pFVar13;
                  pFVar15 = pFVar8;
                  uVar2 = 0;
                  if (bVar17 || pFVar7 <= pFVar13) break;
                  bVar1 = (byte)pFVar13->int_value_;
                  pFVar13 = (Field *)((long)&pFVar13->int_value_ + 1);
                  uVar11 = uVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
                  lVar4 = lVar4 + 7;
                  if (-1 < (char)bVar1) {
                    uVar14 = uVar11 & 0xffffffff;
                  }
                  pFVar15 = pFVar13;
                  uVar2 = (uint)(uVar11 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar14 = 0;
              uVar2 = 0;
            }
            if (bVar10) {
              uVar14 = uVar16;
            }
            uVar11 = (ulong)uVar2;
            if (bVar10) {
              pFVar15 = pFVar9;
              uVar11 = uVar16;
            }
            if (pFVar15 == pFVar9) {
              uVar12 = 0;
              bVar10 = false;
              local_58.int_value_ = uVar16;
            }
            else {
LAB_002397a2:
              pFVar3 = pFVar15;
              bVar10 = true;
              if ((uVar5 < 0x10000) && (uVar16 < 0x10000000)) {
                local_58.int_value_ = uVar14 & 0xffffffff | uVar11 << 0x20;
                uVar12 = uVar16 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
                bVar10 = false;
              }
              else {
                local_58.int_value_ = 0;
                uVar12 = 0;
              }
            }
            break;
          case 1:
            pFVar15 = (Field *)&pFVar9->size_;
            if (pFVar15 <= pFVar7) {
              uVar14 = pFVar9->int_value_;
              uVar11 = uVar14 >> 0x20;
LAB_00239653:
              uVar16 = 0;
              goto LAB_002397a2;
            }
            goto LAB_00239593;
          case 2:
            bVar10 = pFVar9 >= pFVar7;
            uVar11 = uVar6;
            if (pFVar9 < pFVar7) {
              pFVar8 = (Field *)((long)&pFVar9->int_value_ + 1);
              bVar1 = (byte)pFVar9->int_value_;
              uVar14 = (ulong)(bVar1 & 0x7f);
              pFVar15 = pFVar8;
              uVar11 = uVar14;
              if ((char)bVar1 < '\0') {
                lVar4 = 7;
                pFVar13 = pFVar8;
                do {
                  bVar10 = 0x38 < lVar4 - 7U || pFVar7 <= pFVar13;
                  pFVar15 = pFVar8;
                  uVar11 = uVar6;
                  if (bVar10) break;
                  bVar1 = (byte)pFVar13->int_value_;
                  pFVar13 = (Field *)((long)&pFVar13->int_value_ + 1);
                  uVar14 = uVar14 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
                  lVar4 = lVar4 + 7;
                  pFVar15 = pFVar13;
                  uVar11 = uVar14;
                } while ((char)bVar1 < '\0');
              }
            }
            uVar6 = uVar11;
            if (bVar10) {
              pFVar15 = pFVar9;
              uVar6 = 0;
            }
            if ((pFVar15 == pFVar9) || ((ulong)((long)pFVar7 - (long)pFVar15) < uVar6)) {
              uVar14 = 0;
              uVar11 = 0;
              bVar10 = false;
              uVar16 = 0;
            }
            else {
              uVar11 = (ulong)pFVar15 >> 0x20;
              uVar14 = (ulong)pFVar15 & 0xffffffff;
              pFVar15 = (Field *)((long)&pFVar15->int_value_ + uVar6);
              bVar10 = true;
              uVar16 = uVar6;
            }
            if (bVar10) goto LAB_002397a2;
            uVar12 = 0;
            bVar10 = false;
            local_58.int_value_ = 0;
            break;
          default:
            goto switchD_002395f2_caseD_3;
          case 5:
            pFVar15 = (Field *)((long)&pFVar9->int_value_ + 4);
            uVar11 = 0;
            if (pFVar15 <= pFVar7) {
              uVar14 = (ulong)(uint)pFVar9->int_value_;
              goto LAB_00239653;
            }
LAB_00239593:
            uVar12 = 0;
            bVar10 = false;
            local_58.int_value_ = 0;
          }
LAB_002397e8:
        } while (bVar10);
      } while( true );
    }
  } while( true );
}

Assistant:

bool PackagesListConfig::ParseFromArray(const void* raw, size_t size) {
  package_name_filter_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* package_name_filter */:
        package_name_filter_.emplace_back();
        field.get(&package_name_filter_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}